

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_preorder.c
# Opt level: O3

void sp_preorder(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *etree,SuperMatrix *AC)

{
  undefined4 *puVar1;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 n;
  undefined8 uVar5;
  int_t iVar6;
  int_t iVar7;
  undefined4 *puVar8;
  int_t *piVar9;
  int *piVar10;
  void *addr;
  ulong uVar11;
  ulong uVar12;
  undefined4 uVar13;
  char msg [256];
  uint uStack_144;
  char local_138 [264];
  
  AC->Stype = SLU_NCP;
  uVar4 = A->Dtype;
  n = A->Mtype;
  iVar6 = A->nrow;
  iVar7 = A->ncol;
  AC->Dtype = uVar4;
  AC->Mtype = n;
  AC->nrow = iVar6;
  AC->ncol = iVar7;
  puVar1 = (undefined4 *)A->Store;
  puVar8 = (undefined4 *)superlu_malloc(0x28);
  AC->Store = puVar8;
  if (puVar8 == (undefined4 *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ACstore",0x5d);
    superlu_abort_and_exit(local_138);
  }
  *puVar8 = *puVar1;
  uVar5 = *(undefined8 *)(puVar1 + 4);
  *(undefined8 *)(puVar8 + 2) = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)(puVar8 + 4) = uVar5;
  piVar9 = intMalloc(n);
  *(int_t **)(puVar8 + 6) = piVar9;
  if (piVar9 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ACstore->colbeg",0x62);
    superlu_abort_and_exit(local_138);
  }
  piVar9 = intMalloc(n);
  *(int_t **)(puVar8 + 8) = piVar9;
  if (piVar9 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ACstore->colend",100);
    superlu_abort_and_exit(local_138);
  }
  if (0 < (int)n) {
    puVar1 = *(undefined4 **)(puVar1 + 6);
    lVar2 = *(long *)(puVar8 + 6);
    lVar3 = *(long *)(puVar8 + 8);
    uVar13 = *puVar1;
    uVar11 = 0;
    do {
      *(undefined4 *)(lVar2 + (long)perm_c[uVar11] * 4) = uVar13;
      uVar13 = puVar1[uVar11 + 1];
      piVar10 = perm_c + uVar11;
      uVar11 = uVar11 + 1;
      *(undefined4 *)(lVar3 + (long)*piVar10 * 4) = uVar13;
    } while ((uint)n != uVar11);
  }
  if (options->Fact == DOFACT) {
    sp_coletree(*(int_t **)(puVar8 + 6),*(int_t **)(puVar8 + 8),*(int_t **)(puVar8 + 4),A->nrow,
                A->ncol,etree);
    if (options->SymmetricMode == NO) {
      piVar10 = TreePostorder(n,etree);
      addr = superlu_malloc((long)(int)n * 4 + 4);
      if (addr == (void *)0x0) {
        sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for iwork[]",0xaf,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sp_preorder.c"
               );
        superlu_abort_and_exit(local_138);
      }
      if (0 < (int)n) {
        uVar11 = (ulong)(uint)n;
        uVar12 = 0;
        do {
          *(int *)((long)addr + (long)piVar10[uVar12] * 4) = piVar10[etree[uVar12]];
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
        if (0 < (int)n) {
          uVar12 = 0;
          do {
            etree[uVar12] = *(int *)((long)addr + uVar12 * 4);
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
          if (0 < (int)n) {
            lVar2 = *(long *)(puVar8 + 6);
            uVar12 = 0;
            do {
              *(undefined4 *)((long)addr + (long)piVar10[uVar12] * 4) =
                   *(undefined4 *)(lVar2 + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
            if (0 < (int)n) {
              lVar2 = *(long *)(puVar8 + 6);
              uVar12 = 0;
              do {
                *(undefined4 *)(lVar2 + uVar12 * 4) = *(undefined4 *)((long)addr + uVar12 * 4);
                uVar12 = uVar12 + 1;
              } while (uVar11 != uVar12);
              if (0 < (int)n) {
                lVar2 = *(long *)(puVar8 + 8);
                uVar12 = 0;
                do {
                  *(undefined4 *)((long)addr + (long)piVar10[uVar12] * 4) =
                       *(undefined4 *)(lVar2 + uVar12 * 4);
                  uVar12 = uVar12 + 1;
                } while (uVar11 != uVar12);
                if (0 < (int)n) {
                  lVar2 = *(long *)(puVar8 + 8);
                  uVar12 = 0;
                  do {
                    *(undefined4 *)(lVar2 + uVar12 * 4) = *(undefined4 *)((long)addr + uVar12 * 4);
                    uVar12 = uVar12 + 1;
                  } while (uVar11 != uVar12);
                  if (0 < (int)n) {
                    uVar12 = 0;
                    do {
                      *(int *)((long)addr + uVar12 * 4) = piVar10[perm_c[uVar12]];
                      uVar12 = uVar12 + 1;
                    } while (uVar11 != uVar12);
                    if (0 < (int)n) {
                      uVar12 = 0;
                      do {
                        perm_c[uVar12] = *(int *)((long)addr + uVar12 * 4);
                        uVar12 = uVar12 + 1;
                      } while (uVar11 != uVar12);
                    }
                  }
                }
              }
            }
          }
        }
      }
      superlu_free(piVar10);
      superlu_free(addr);
    }
  }
  return;
}

Assistant:

void sp_preorder(const superlu_options_t *options,  SuperMatrix *A, int *perm_c,
                 int *etree, SuperMatrix *AC)
{
    NCformat  *Astore;
    NCPformat *ACstore;
    int       *iwork, *post;
    register  int n, i;
    extern void check_perm(const char *what, int n, const int *perm);
	
    n = A->ncol;
    
    /* Apply column permutation perm_c to A's column pointers so to
       obtain NCP format in AC = A*Pc.  */
    AC->Stype       = SLU_NCP;
    AC->Dtype       = A->Dtype;
    AC->Mtype       = A->Mtype;
    AC->nrow        = A->nrow;
    AC->ncol        = A->ncol;
    Astore          = A->Store;
    ACstore = AC->Store = (void *) SUPERLU_MALLOC( sizeof(NCPformat) );
    if ( !ACstore ) ABORT("SUPERLU_MALLOC fails for ACstore");
    ACstore->nnz    = Astore->nnz;
    ACstore->nzval  = Astore->nzval;
    ACstore->rowind = Astore->rowind;
    ACstore->colbeg = intMalloc(n);
    if ( !(ACstore->colbeg) ) ABORT("SUPERLU_MALLOC fails for ACstore->colbeg");
    ACstore->colend = intMalloc(n);
    if ( !(ACstore->colend) ) ABORT("SUPERLU_MALLOC fails for ACstore->colend");

#if ( DEBUGlevel>=1 )
    check_perm("Initial perm_c", n, perm_c);
#endif      
#if ( DEBUGlevel>=2 )
    print_int_vec("pre_order:", n, perm_c);
#endif      

    for (i = 0; i < n; i++) {
	ACstore->colbeg[perm_c[i]] = Astore->colptr[i]; 
	ACstore->colend[perm_c[i]] = Astore->colptr[i+1];
    }
	
    if ( options->Fact == DOFACT ) {
#undef ETREE_ATplusA
#ifdef ETREE_ATplusA
        /*--------------------------------------------
	  COMPUTE THE ETREE OF Pc*(A'+A)*Pc'.
	  --------------------------------------------*/
        int *b_colptr, *b_rowind, bnz, j;
	int *c_colbeg, *c_colend;

        /*printf("Use etree(A'+A)\n");*/

	/* Form B = A + A'. */
	at_plus_a(n, Astore->nnz, Astore->colptr, Astore->rowind,
		  &bnz, &b_colptr, &b_rowind);

	/* Form C = Pc*B*Pc'. */
	c_colbeg = (int*) SUPERLU_MALLOC(2*n*sizeof(int));
	c_colend = c_colbeg + n;
	if (!c_colbeg ) ABORT("SUPERLU_MALLOC fails for c_colbeg/c_colend");
	for (i = 0; i < n; i++) {
	    c_colbeg[perm_c[i]] = b_colptr[i]; 
  	    c_colend[perm_c[i]] = b_colptr[i+1];
	}
	for (j = 0; j < n; ++j) {
	    for (i = c_colbeg[j]; i < c_colend[j]; ++i) {
	        b_rowind[i] = perm_c[b_rowind[i]];
	    }
	}

	/* Compute etree of C. */
	sp_symetree(c_colbeg, c_colend, b_rowind, n, etree);

	SUPERLU_FREE(b_colptr);
	if ( bnz ) SUPERLU_FREE(b_rowind);
	SUPERLU_FREE(c_colbeg);
	
#else
        /*--------------------------------------------
	  COMPUTE THE COLUMN ELIMINATION TREE.
	  --------------------------------------------*/
	sp_coletree(ACstore->colbeg, ACstore->colend, ACstore->rowind,
		    A->nrow, A->ncol, etree);
#endif
#if ( DEBUGlevel>=2 )
	print_int_vec("etree:", n, etree);
#endif	
	
	/* In symmetric mode, do not do postorder here. */
	if ( options->SymmetricMode == NO ) {
	    /* Post order etree */
	    post = (int *) TreePostorder(n, etree);
	    /* for (i = 0; i < n+1; ++i) inv_post[post[i]] = i;
	       iwork = post; */

#if ( DEBUGlevel>=1 )
	    check_perm("post", n, post);	
#endif	
#if ( DEBUGlevel>=2 )
	    print_int_vec("post:", n+1, post);
#endif	
	    iwork = (int*) SUPERLU_MALLOC((n+1)*sizeof(int)); 
	    if ( !iwork ) ABORT("SUPERLU_MALLOC fails for iwork[]");

	    /* Renumber etree in postorder */
	    for (i = 0; i < n; ++i) iwork[post[i]] = post[etree[i]];
	    for (i = 0; i < n; ++i) etree[i] = iwork[i];

#if ( DEBUGlevel>=2 )
	    print_int_vec("postorder etree:", n, etree);
#endif
	
	    /* Postmultiply A*Pc by post[] */
	    for (i = 0; i < n; ++i) iwork[post[i]] = ACstore->colbeg[i];
	    for (i = 0; i < n; ++i) ACstore->colbeg[i] = iwork[i];
	    for (i = 0; i < n; ++i) iwork[post[i]] = ACstore->colend[i];
	    for (i = 0; i < n; ++i) ACstore->colend[i] = iwork[i];

	    for (i = 0; i < n; ++i)
	        iwork[i] = post[perm_c[i]];  /* product of perm_c and post */
	    for (i = 0; i < n; ++i) perm_c[i] = iwork[i];

#if ( DEBUGlevel>=1 )
	    check_perm("final perm_c", n, perm_c);	
#endif
#if ( DEBUGlevel>=2 )
	    print_int_vec("Pc*post:", n, perm_c);
#endif
	    SUPERLU_FREE (post);
	    SUPERLU_FREE (iwork);
	} /* end postordering */

    } /* if options->Fact == DOFACT ... */

}